

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

void tcu::clear(PixelBufferAccess *access,IVec4 *color)

{
  uint uVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_8_2_c961180f pixel;
  PixelBufferAccess local_50;
  
  uVar6 = TextureFormat::getPixelSize((TextureFormat *)access);
  iVar7 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar15 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar16 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
  if (((uVar6 == (access->super_ConstPixelBufferAccess).m_pitch.m_data[0]) && ((int)uVar6 < 8)) &&
     (0x7f < iVar15 * iVar7 * iVar16)) {
    iVar15 = 0;
    PixelBufferAccess::PixelBufferAccess(&local_50,(TextureFormat *)access,1,1,1,0,0,&pixel);
    PixelBufferAccess::setPixel(&local_50,color,0,0,0);
    auVar5 = _DAT_00942940;
    auVar4 = _DAT_00942930;
    auVar3 = _DAT_00942880;
    iVar7 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
    if (0 < iVar7) {
      iVar16 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
      do {
        if (0 < iVar16) {
          iVar7 = 0;
          do {
            pvVar2 = (access->super_ConstPixelBufferAccess).m_data;
            uVar1 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
            lVar12 = (long)((access->super_ConstPixelBufferAccess).m_pitch.m_data[1] * iVar7);
            lVar14 = (long)((access->super_ConstPixelBufferAccess).m_pitch.m_data[2] * iVar15);
            uVar10 = (long)pvVar2 + lVar14 + lVar12;
            if (uVar6 == 4) {
              if ((uVar10 & 3) != 0) goto LAB_00901736;
              if (0 < (int)uVar1) {
                lVar8 = (ulong)uVar1 - 1;
                auVar18._8_4_ = (int)lVar8;
                auVar18._0_8_ = lVar8;
                auVar18._12_4_ = (int)((ulong)lVar8 >> 0x20);
                lVar14 = lVar14 + lVar12;
                auVar18 = auVar18 ^ auVar5;
                uVar10 = 0;
                auVar19 = auVar3;
                auVar20 = auVar4;
                do {
                  auVar21 = auVar19 ^ auVar5;
                  iVar16 = auVar18._4_4_;
                  if ((bool)(~(auVar21._4_4_ == iVar16 && auVar18._0_4_ < auVar21._0_4_ ||
                              iVar16 < auVar21._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar2 + uVar10 * 4 + lVar14) = pixel.u64._0_4_;
                  }
                  if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
                      auVar21._12_4_ <= auVar18._12_4_) {
                    *(undefined4 *)((long)pvVar2 + uVar10 * 4 + lVar14 + 4) = pixel.u64._0_4_;
                  }
                  iVar9 = SUB164(auVar20 ^ auVar5,4);
                  if (iVar9 <= iVar16 &&
                      (iVar9 != iVar16 || SUB164(auVar20 ^ auVar5,0) <= auVar18._0_4_)) {
                    *(undefined4 *)((long)pvVar2 + uVar10 * 4 + lVar14 + 8) = pixel.u64._0_4_;
                    *(undefined4 *)((long)pvVar2 + uVar10 * 4 + lVar14 + 0xc) = pixel.u64._0_4_;
                  }
                  uVar10 = uVar10 + 4;
                  lVar12 = auVar19._8_8_;
                  auVar19._0_8_ = auVar19._0_8_ + 4;
                  auVar19._8_8_ = lVar12 + 4;
                  lVar12 = auVar20._8_8_;
                  auVar20._0_8_ = auVar20._0_8_ + 4;
                  auVar20._8_8_ = lVar12 + 4;
                } while ((uVar1 + 3 & 0xfffffffc) != uVar10);
              }
            }
            else if ((uVar6 == 8) && ((uVar10 & 7) == 0)) {
              if (0 < (int)uVar1) {
                lVar8 = (ulong)uVar1 - 1;
                auVar17._8_4_ = (int)lVar8;
                auVar17._0_8_ = lVar8;
                auVar17._12_4_ = (int)((ulong)lVar8 >> 0x20);
                uVar10 = 0;
                auVar21 = auVar3;
                do {
                  auVar19 = auVar17 ^ auVar5;
                  auVar20 = auVar21 ^ auVar5;
                  if ((bool)(~(auVar20._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar20._0_4_ ||
                              auVar19._4_4_ < auVar20._4_4_) & 1)) {
                    *(ulong *)((long)pvVar2 + uVar10 * 8 + lVar14 + lVar12) =
                         CONCAT44(pixel.u64._4_4_,pixel.u64._0_4_);
                  }
                  if ((auVar20._12_4_ != auVar19._12_4_ || auVar20._8_4_ <= auVar19._8_4_) &&
                      auVar20._12_4_ <= auVar19._12_4_) {
                    *(ulong *)((long)pvVar2 + uVar10 * 8 + lVar14 + lVar12 + 8) =
                         CONCAT44(pixel.u64._4_4_,pixel.u64._0_4_);
                  }
                  uVar10 = uVar10 + 2;
                  lVar8 = auVar21._8_8_;
                  auVar21._0_8_ = auVar21._0_8_ + 2;
                  auVar21._8_8_ = lVar8 + 2;
                } while ((uVar1 + 1 & 0xfffffffe) != uVar10);
              }
            }
            else {
LAB_00901736:
              if (0 < (int)uVar1) {
                lVar12 = 0;
                uVar11 = 0;
                do {
                  if (0 < (int)uVar6) {
                    uVar13 = 0;
                    do {
                      *(undefined1 *)(uVar10 + (long)((int)lVar12 + (int)uVar13)) =
                           *(undefined1 *)
                            ((long)local_50.super_ConstPixelBufferAccess.m_size.m_data +
                            (uVar13 - 0x10));
                      uVar13 = uVar13 + 1;
                    } while (uVar6 != uVar13);
                  }
                  uVar11 = uVar11 + 1;
                  lVar12 = lVar12 + (ulong)uVar6;
                } while (uVar11 != uVar1);
              }
            }
            iVar7 = iVar7 + 1;
            iVar16 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
          } while (iVar7 < iVar16);
          iVar7 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < iVar7);
    }
  }
  else if (0 < iVar16) {
    iVar9 = 0;
    do {
      if (0 < iVar15) {
        iVar16 = 0;
        do {
          if (0 < iVar7) {
            iVar15 = 0;
            do {
              PixelBufferAccess::setPixel(access,color,iVar15,iVar16,iVar9);
              iVar15 = iVar15 + 1;
              iVar7 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
            } while (iVar15 < iVar7);
            iVar15 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < iVar15);
        iVar16 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < iVar16);
  }
  return;
}

Assistant:

void clear (const PixelBufferAccess& access, const IVec4& color)
{
	const int	pixelSize				= access.getFormat().getPixelSize();
	const int	pixelPitch				= access.getPixelPitch();
	const bool	rowPixelsTightlyPacked	= (pixelSize == pixelPitch);

	if (access.getWidth()*access.getHeight()*access.getDepth() >= CLEAR_OPTIMIZE_THRESHOLD &&
		pixelSize < CLEAR_OPTIMIZE_MAX_PIXEL_SIZE && rowPixelsTightlyPacked)
	{
		// Convert to destination format.
		union
		{
			deUint8		u8[CLEAR_OPTIMIZE_MAX_PIXEL_SIZE];
			deUint64	u64; // Forces 64-bit alignment.
		} pixel;
		DE_STATIC_ASSERT(sizeof(pixel) == CLEAR_OPTIMIZE_MAX_PIXEL_SIZE);
		PixelBufferAccess(access.getFormat(), 1, 1, 1, 0, 0, &pixel.u8[0]).setPixel(color, 0, 0);

		for (int z = 0; z < access.getDepth(); z++)
			for (int y = 0; y < access.getHeight(); y++)
				fillRow(access, y, z, pixelSize, &pixel.u8[0]);
	}
	else
	{
		for (int z = 0; z < access.getDepth(); z++)
			for (int y = 0; y < access.getHeight(); y++)
				for (int x = 0; x < access.getWidth(); x++)
					access.setPixel(color, x, y, z);
	}
}